

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptString::Concat(JavascriptString *pstLeft,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t lenRight;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  ScriptContext *scriptContext;
  char16_t *pcVar7;
  char16_t *local_38;
  JavascriptString *pstRight_local;
  JavascriptString *pstLeft_local;
  
  if (pstLeft == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x228,"(pstLeft != nullptr)","Must have a valid left string");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x229,"(pstRight != nullptr)","Must have a valid right string");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsFinalized(pstLeft);
  if (bVar2) {
    cVar4 = GetLength(pstLeft);
    if ((cVar4 == 0) || (cVar4 = GetLength(pstRight), cVar4 == 0)) {
      pJVar6 = Concat_OneEmpty(pstLeft,pstRight);
      return pJVar6;
    }
  }
  else {
    bVar2 = VarIs<Js::CompoundString,Js::JavascriptString>(pstLeft);
    if (bVar2) {
      pJVar6 = Concat_Compound(pstLeft,pstRight);
      return pJVar6;
    }
    bVar2 = VirtualTableInfo<Js::ConcatString>::HasVirtualTable(pstLeft);
    if (bVar2) {
      pJVar6 = Concat_ConcatToCompound(pstLeft,pstRight);
      return pJVar6;
    }
  }
  cVar4 = GetLength(pstLeft);
  if ((cVar4 == 1) && (cVar4 = GetLength(pstRight), cVar4 == 1)) {
    pstLeft_local = Concat_BothOneChar(pstLeft,pstRight);
  }
  else {
    scriptContext = RecyclableObject::GetScriptContext(&pstLeft->super_RecyclableObject);
    cVar4 = GetLength(pstLeft);
    lenRight = GetLength(pstRight);
    StringProfiler::RecordConcatenation(scriptContext,cVar4,lenRight,ConcatType_ConcatTree);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
    if (bVar2) {
      bVar2 = IsFinalized(pstRight);
      if (bVar2) {
        local_38 = GetString(pstRight);
      }
      else {
        local_38 = L"";
      }
      bVar3 = IsFinalized(pstRight);
      bVar2 = true;
      if (bVar3) {
        cVar4 = GetLength(pstRight);
        bVar2 = 8 < cVar4;
      }
      pcVar7 = L"";
      if (bVar2) {
        pcVar7 = L"...";
      }
      Output::Print(L"JavascriptString::Concat(\"%.8s%s\") - creating ConcatString\n",local_38,
                    pcVar7);
      Output::Flush();
    }
    pstLeft_local = (JavascriptString *)ConcatString::New(pstLeft,pstRight);
  }
  return pstLeft_local;
}

Assistant:

JavascriptString* JavascriptString::Concat(JavascriptString* pstLeft, JavascriptString* pstRight)
    {
        AssertMsg(pstLeft != nullptr, "Must have a valid left string");
        AssertMsg(pstRight != nullptr, "Must have a valid right string");

        if(!pstLeft->IsFinalized())
        {
            if(VarIs<CompoundString>(pstLeft))
            {
                return Concat_Compound(pstLeft, pstRight);
            }

            if(VirtualTableInfo<ConcatString>::HasVirtualTable(pstLeft))
            {
                return Concat_ConcatToCompound(pstLeft, pstRight);
            }
        }
        else if(pstLeft->GetLength() == 0 || pstRight->GetLength() == 0)
        {
            return Concat_OneEmpty(pstLeft, pstRight);
        }

        if(pstLeft->GetLength() != 1 || pstRight->GetLength() != 1)
        {
#ifdef PROFILE_STRINGS
            StringProfiler::RecordConcatenation(pstLeft->GetScriptContext(), pstLeft->GetLength(), pstRight->GetLength(), ConcatType_ConcatTree);
#endif
            if(PHASE_TRACE_StringConcat)
            {
                Output::Print(
                    _u("JavascriptString::Concat(\"%.8s%s\") - creating ConcatString\n"),
                    pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                    !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
                Output::Flush();
            }

            return ConcatString::New(pstLeft, pstRight);
        }

        return Concat_BothOneChar(pstLeft, pstRight);
    }